

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O0

void * mempool_alloc(mempool *pool)

{
  rlist *prVar1;
  void *pvVar2;
  bool bVar3;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  void *ptr;
  mslab *local_48;
  mslab *slab;
  mempool *pool_local;
  rlist *shift;
  
  local_48 = pool->first_hot_slab;
  if (local_48 == (mslab *)0x0) {
    if (pool->spare == (mslab *)0x0) {
      local_48 = (mslab *)slab_get_with_order(pool->cache,pool->slab_order);
      if (local_48 == (mslab *)0x0) {
        bVar3 = false;
        if ((pool->cold_slabs).next == (pool->cold_slabs).prev) {
          bVar3 = (pool->cold_slabs).next == &pool->cold_slabs;
        }
        if (bVar3) {
          return (void *)0x0;
        }
        prVar1 = (pool->cold_slabs).next;
        (pool->cold_slabs).next = prVar1->next;
        prVar1->next->prev = &pool->cold_slabs;
        prVar1->prev = prVar1;
        prVar1->next = prVar1;
        local_48 = (mslab *)(prVar1 + -5);
      }
      else {
        mslab_create(local_48,pool);
        prVar1 = &(local_48->slab).next_in_list;
        prVar1->prev = &(pool->slabs).slabs;
        (local_48->slab).next_in_list.next = (pool->slabs).slabs.next;
        prVar1->prev->next = prVar1;
        ((local_48->slab).next_in_list.next)->prev = prVar1;
        (pool->slabs).stats.total = (local_48->slab).size + (pool->slabs).stats.total;
      }
    }
    else {
      local_48 = pool->spare;
      pool->spare = (mslab *)0x0;
    }
    if ((local_48->in_hot_slabs & 1U) != 0) {
      __assert_fail("slab->in_hot_slabs == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/mempool.c"
                    ,0xd1,"void *mempool_alloc(struct mempool *)");
    }
    mslab_tree_insert(&pool->hot_slabs,local_48);
    local_48->in_hot_slabs = true;
    pool->first_hot_slab = local_48;
  }
  (pool->slabs).stats.used = (ulong)pool->objsize + (pool->slabs).stats.used;
  pvVar2 = mslab_alloc(pool,local_48);
  if (pvVar2 != (void *)0x0) {
    return pvVar2;
  }
  __assert_fail("ptr != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/mempool.c"
                ,0xd8,"void *mempool_alloc(struct mempool *)");
}

Assistant:

void *
mempool_alloc(struct mempool *pool)
{
	struct mslab *slab = pool->first_hot_slab;
	if (slab == NULL) {
		if (pool->spare) {
			slab = pool->spare;
			pool->spare = NULL;

		} else if ((slab = (struct mslab *)
			    slab_get_with_order(pool->cache,
						pool->slab_order))) {
			mslab_create(slab, pool);
			slab_list_add(&pool->slabs, &slab->slab, next_in_list);
		} else if (! rlist_empty(&pool->cold_slabs)) {
			slab = rlist_shift_entry(&pool->cold_slabs, struct mslab,
						 next_in_cold);
		} else {
			return NULL;
		}
		assert(slab->in_hot_slabs == false);
		mslab_tree_insert(&pool->hot_slabs, slab);
		slab->in_hot_slabs = true;
		pool->first_hot_slab = slab;
	}
	pool->slabs.stats.used += pool->objsize;
	void *ptr = mslab_alloc(pool, slab);
	assert(ptr != NULL);
	VALGRIND_MALLOCLIKE_BLOCK(ptr, pool->objsize, 0, 0);
	return ptr;
}